

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O0

int CBS_get_asn1_int64_with_tag(CBS *cbs,int64_t *out,CBS_ASN1_TAG tag)

{
  int iVar1;
  uint8_t *src;
  uint64_t uVar2;
  undefined1 local_50 [8];
  uint8_t sign_extend [8];
  size_t len;
  uint8_t *data;
  CBS bytes;
  int is_negative;
  CBS_ASN1_TAG tag_local;
  int64_t *out_local;
  CBS *cbs_local;
  
  bytes.len._4_4_ = tag;
  iVar1 = CBS_get_asn1(cbs,(CBS *)&data,tag);
  if ((iVar1 != 0) &&
     (iVar1 = CBS_is_valid_asn1_integer((CBS *)&data,(int *)&bytes.len), iVar1 != 0)) {
    src = CBS_data((CBS *)&data);
    sign_extend = (uint8_t  [8])CBS_len((CBS *)&data);
    if (8 < (ulong)sign_extend) {
      return 0;
    }
    iVar1 = 0;
    if ((int)bytes.len != 0) {
      iVar1 = 0xff;
    }
    OPENSSL_memset(local_50,iVar1,8);
    OPENSSL_memcpy(sign_extend + -(long)sign_extend,src,(size_t)sign_extend);
    uVar2 = CRYPTO_load_u64_be(local_50);
    *out = uVar2;
    return 1;
  }
  return 0;
}

Assistant:

int CBS_get_asn1_int64_with_tag(CBS *cbs, int64_t *out, CBS_ASN1_TAG tag) {
  int is_negative;
  CBS bytes;
  if (!CBS_get_asn1(cbs, &bytes, tag) ||
      !CBS_is_valid_asn1_integer(&bytes, &is_negative)) {
    return 0;
  }
  const uint8_t *data = CBS_data(&bytes);
  const size_t len = CBS_len(&bytes);
  if (len > sizeof(int64_t)) {
    return 0;
  }
  uint8_t sign_extend[sizeof(int64_t)];
  OPENSSL_memset(sign_extend, is_negative ? 0xff : 0, sizeof(sign_extend));
  OPENSSL_memcpy(sign_extend + sizeof(int64_t) - len, data, len);
  *out = CRYPTO_load_u64_be(sign_extend);
  return 1;
}